

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

Symbol left_section_op(Env *env,uint32_t start)

{
  State *pSVar1;
  Space SVar2;
  Symbol SVar3;
  uint uVar4;
  TSLexer *pTVar5;
  
  SVar3 = FAIL;
  if (env->symbols[0x27] == true) {
    advance_before(env,start);
    SVar2 = skip_whitespace(env);
    pSVar1 = env->state;
    uVar4 = (pSVar1->lookahead).offset + start;
    if (uVar4 < (pSVar1->lookahead).size) {
      pTVar5 = (TSLexer *)((pSVar1->lookahead).contents + uVar4);
    }
    else {
      advance_before(env,start);
      pTVar5 = env->lexer;
    }
    SVar3 = LEFT_SECTION_OP;
    if (((pTVar5->lookahead != 0x29) && (SVar3 = FAIL, SVar2 != NoSpace)) &&
       (SVar3 = NO_SECTION_OP, env->symbols[0x28] == false)) {
      SVar3 = FAIL;
    }
  }
  return SVar3;
}

Assistant:

static Symbol left_section_op(Env *env, uint32_t start) {
  if (valid(env, LEFT_SECTION_OP)) {
    advance_before(env, start);
    Space space = skip_whitespace(env);
    if (char_at(env, start, ')')) return finish(LEFT_SECTION_OP, "left section");
    if (space != NoSpace) return finish_if_valid(env, NO_SECTION_OP, "left section");
  }
  return FAIL;
}